

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_file.cpp
# Opt level: O1

void Omega_h::binary::write_array<signed_char>
               (ostream *stream,Read<signed_char> *array,bool is_compressed,bool needs_swapping)

{
  int *piVar1;
  Alloc *pAVar2;
  int iVar3;
  void *pvVar4;
  char *pcVar5;
  uint uVar6;
  uLong dest_bytes;
  HostRead<signed_char> uncompressed;
  Read<signed_char> swapped;
  ulong local_80;
  Read<signed_char> local_78;
  HostRead<signed_char> local_68;
  uint local_58;
  undefined4 uStack_54;
  void *local_50;
  Read<signed_char> local_48;
  ulong local_38;
  
  pAVar2 = (array->write_).shared_alloc_.alloc;
  if (((ulong)pAVar2 & 1) == 0) {
    uVar6 = (uint)pAVar2->size;
  }
  else {
    uVar6 = (uint)((ulong)pAVar2 >> 3);
  }
  local_58 = uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8 | uVar6 << 0x18;
  if (!needs_swapping) {
    local_58 = uVar6;
  }
  std::ostream::write((char *)stream,(long)&local_58);
  local_48.write_.shared_alloc_.alloc = (array->write_).shared_alloc_.alloc;
  if (((ulong)local_48.write_.shared_alloc_.alloc & 7) == 0 &&
      local_48.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_48.write_.shared_alloc_.alloc =
           (Alloc *)((local_48.write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_48.write_.shared_alloc_.alloc)->use_count =
           (local_48.write_.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_48.write_.shared_alloc_.direct_ptr = (array->write_).shared_alloc_.direct_ptr;
  swap_bytes<signed_char>((binary *)&local_58,&local_48,needs_swapping);
  pAVar2 = local_48.write_.shared_alloc_.alloc;
  if (((ulong)local_48.write_.shared_alloc_.alloc & 7) == 0 &&
      local_48.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_48.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_48.write_.shared_alloc_.alloc);
      operator_delete(pAVar2,0x48);
    }
  }
  local_78.write_.shared_alloc_.alloc = (Alloc *)CONCAT44(uStack_54,local_58);
  if ((local_58 & 7) == 0 && local_78.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_78.write_.shared_alloc_.alloc =
           (Alloc *)((local_78.write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_78.write_.shared_alloc_.alloc)->use_count =
           (local_78.write_.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_78.write_.shared_alloc_.direct_ptr = local_50;
  HostRead<signed_char>::HostRead(&local_68,&local_78);
  pAVar2 = local_78.write_.shared_alloc_.alloc;
  if (((ulong)local_78.write_.shared_alloc_.alloc & 7) == 0 &&
      local_78.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_78.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_78.write_.shared_alloc_.alloc);
      operator_delete(pAVar2,0x48);
    }
  }
  if (is_compressed) {
    local_80 = compressBound((long)(int)uVar6);
    pvVar4 = operator_new__(local_80);
    pcVar5 = HostRead<signed_char>::data(&local_68);
    pcVar5 = nonnull<signed_char_const>(pcVar5);
    iVar3 = compress2(pvVar4,&local_80,pcVar5,(long)(int)uVar6,1);
    if (iVar3 != 0) {
      fail("assertion %s failed at %s +%d\n","ret == Z_OK",
           "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_file.cpp"
           ,0x87);
    }
    local_38 = local_80 >> 0x38 | (local_80 & 0xff000000000000) >> 0x28 |
               (local_80 & 0xff0000000000) >> 0x18 | (local_80 & 0xff00000000) >> 8 |
               (local_80 & 0xff000000) << 8 | (local_80 & 0xff0000) << 0x18 |
               (local_80 & 0xff00) << 0x28 | local_80 << 0x38;
    if (!needs_swapping) {
      local_38 = local_80;
    }
    std::ostream::write((char *)stream,(long)&local_38);
    std::ostream::write((char *)stream,(long)pvVar4);
    operator_delete__(pvVar4);
  }
  else {
    pcVar5 = HostRead<signed_char>::data(&local_68);
    pcVar5 = nonnull<signed_char_const>(pcVar5);
    std::ostream::write((char *)stream,(long)pcVar5);
  }
  if (((ulong)local_68.read_.write_.shared_alloc_.alloc & 7) == 0 &&
      local_68.read_.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_68.read_.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_68.read_.write_.shared_alloc_.alloc);
      operator_delete(local_68.read_.write_.shared_alloc_.alloc,0x48);
    }
  }
  pAVar2 = (Alloc *)CONCAT44(uStack_54,local_58);
  if ((local_58 & 7) == 0 && pAVar2 != (Alloc *)0x0) {
    piVar1 = &pAVar2->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(pAVar2);
      operator_delete(pAVar2,0x48);
    }
  }
  return;
}

Assistant:

void write_array(std::ostream& stream, Read<T> array, bool is_compressed,
    bool needs_swapping) {
  LO size = array.size();
  write_value(stream, size, needs_swapping);
  Read<T> swapped = swap_bytes(array, needs_swapping);
  HostRead<T> uncompressed(swapped);
  I64 uncompressed_bytes =
      static_cast<I64>(static_cast<std::size_t>(size) * sizeof(T));
#ifdef OMEGA_H_USE_ZLIB
  if (is_compressed) {
    uLong source_bytes = static_cast<uLong>(uncompressed_bytes);
    uLong dest_bytes = ::compressBound(source_bytes);
    auto compressed = new ::Bytef[dest_bytes];
    int ret = ::compress2(compressed, &dest_bytes,
        reinterpret_cast<const ::Bytef*>(nonnull(uncompressed.data())),
        source_bytes, Z_BEST_SPEED);
    OMEGA_H_CHECK(ret == Z_OK);
    I64 compressed_bytes = static_cast<I64>(dest_bytes);
    write_value(stream, compressed_bytes, needs_swapping);
    stream.write(reinterpret_cast<const char*>(compressed), compressed_bytes);
    delete[] compressed;
  } else
#else
  OMEGA_H_CHECK(is_compressed == false);
#endif
  {
    stream.write(reinterpret_cast<const char*>(nonnull(uncompressed.data())),
        uncompressed_bytes);
  }
}